

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall tst_RoleMaskProxyModel::testMoveColumnBefore(tst_RoleMaskProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QAbstractItemModelTester *this_00;
  int iVar4;
  int iVar5;
  QPersistentModelIndex proxyParentIdx;
  RoleMaskProxyModel proxyModel;
  QPersistentModelIndex parentIdx;
  GenericModel baseModel;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined8 local_b0;
  anon_union_24_3_e3d07ef4_for_data local_a0;
  QPersistentModelIndex local_88 [8];
  QModelIndex local_80;
  QModelIndex local_68;
  QPersistentModelIndex local_50 [8];
  QModelIndex local_48;
  
  iVar4 = (int)&local_c8;
  iVar3 = (int)&local_c8;
  GenericModel::GenericModel((GenericModel *)&local_48,(QObject *)0x0);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  GenericModel::insertColumns((int)&local_48,0,(QModelIndex *)&DAT_00000005);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  GenericModel::insertRows((int)&local_48,0,(QModelIndex *)0x2);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  testMoveColumnBefore::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_48,(QAbstractItemModel *)local_c8.data,
             (QModelIndex *)0x0,iVar4);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  iVar5 = (int)&local_c8;
  GenericModel::index(iVar5,(int)&local_48,(QModelIndex *)0x1);
  QPersistentModelIndex::QPersistentModelIndex(local_50,(QModelIndex *)&local_c8);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c8,local_50);
  GenericModel::insertColumns((int)&local_48,0,(QModelIndex *)&DAT_00000005);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c8,local_50);
  GenericModel::insertRows((int)&local_48,0,(QModelIndex *)0x2);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c8,local_50);
  testMoveColumnBefore::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_48,(QAbstractItemModel *)local_c8.data,
             (QModelIndex *)0x32,iVar3);
  RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&local_68,(QObject *)0x0);
  this_00 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&local_68,QtTest,(QObject *)&local_48);
  *(undefined ***)this_00 = &PTR_metaObject_001339b0;
  RoleMaskProxyModel::addMaskedRole((int)&local_68);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&local_68);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a0,local_50);
  QIdentityProxyModel::mapFromSource((QModelIndex *)&local_c8);
  QPersistentModelIndex::QPersistentModelIndex(local_88,(QModelIndex *)&local_c8);
  iVar4 = 0;
  do {
    local_c8._forAlignment = -NAN;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = 0;
    iVar3 = QIdentityProxyModel::columnCount(&local_68);
    if (iVar3 <= iVar4) {
      iVar4 = 0;
      goto LAB_00110cfa;
    }
    local_80.r = -1;
    local_80.c = -1;
    local_80.i = 0;
    local_80.m = (QAbstractItemModel *)0x0;
    QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
    QVariant::QVariant((QVariant *)&local_c8,iVar4 + 1000);
    bVar1 = (bool)RoleMaskProxyModel::setData(&local_68,(QVariant *)&local_a0,iVar5);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(0, i), 1000 + i, Qt::UserRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x185);
    QVariant::~QVariant((QVariant *)&local_c8);
    iVar4 = iVar4 + 1;
  } while (cVar2 != '\0');
  goto LAB_001122e2;
  while( true ) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,local_88);
    QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
    QVariant::QVariant((QVariant *)&local_c8,iVar4 + 2000);
    bVar1 = (bool)RoleMaskProxyModel::setData(&local_68,(QVariant *)&local_a0,iVar5);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(0, i, proxyParentIdx), 2000 + i, Qt::UserRole)"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x187);
    QVariant::~QVariant((QVariant *)&local_c8);
    iVar4 = iVar4 + 1;
    if (cVar2 == '\0') break;
LAB_00110cfa:
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_c8,local_88);
    iVar3 = QIdentityProxyModel::columnCount(&local_68);
    if (iVar3 <= iVar4) {
      local_c8._forAlignment = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      local_a0._forAlignment = -NAN;
      local_a0._8_8_ = 0;
      local_a0._16_8_ = (long *)0x0;
      bVar1 = (bool)GenericModel::moveColumns(&local_48,iVar5,4,(QModelIndex *)0x1,(int)&local_a0);
      cVar2 = QTest::qVerify(bVar1,"baseModel.moveColumns(QModelIndex(), 4, 1, QModelIndex(), 1)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x188);
      if (cVar2 != '\0') {
        local_80.r = -1;
        local_80.c = -1;
        local_80.i = 0;
        local_80.m = (QAbstractItemModel *)0x0;
        QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
        if ((long *)local_a0._16_8_ == (long *)0x0) {
          local_c8.shared = (PrivateShared *)0x0;
          local_c8._8_8_ = 0;
          local_c8._16_8_ = 0;
          local_b0 = 2;
        }
        else {
          (**(code **)(*(long *)local_a0._16_8_ + 0x90))(&local_c8,local_a0._16_8_,&local_a0,0x100);
        }
        iVar4 = QVariant::toInt((bool *)local_c8.data);
        cVar2 = QTest::qCompare(iVar4,1000,"proxyModel.index(0, 0).data(Qt::UserRole).toInt()",
                                "1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x189);
        QVariant::~QVariant((QVariant *)&local_c8);
        if (cVar2 != '\0') {
          local_80.r = -1;
          local_80.c = -1;
          local_80.i = 0;
          local_80.m = (QAbstractItemModel *)0x0;
          QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
          if ((long *)local_a0._16_8_ == (long *)0x0) {
            local_c8.shared = (PrivateShared *)0x0;
            local_c8._8_8_ = 0;
            local_c8._16_8_ = 0;
            local_b0 = 2;
          }
          else {
            (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                      (&local_c8,local_a0._16_8_,&local_a0,0x100);
          }
          iVar4 = QVariant::toInt((bool *)local_c8.data);
          cVar2 = QTest::qCompare(iVar4,0x3ec,"proxyModel.index(0, 1).data(Qt::UserRole).toInt()",
                                  "1004",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x18a);
          QVariant::~QVariant((QVariant *)&local_c8);
          if (cVar2 != '\0') {
            local_80.r = -1;
            local_80.c = -1;
            local_80.i = 0;
            local_80.m = (QAbstractItemModel *)0x0;
            QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
            if ((long *)local_a0._16_8_ == (long *)0x0) {
              local_c8.shared = (PrivateShared *)0x0;
              local_c8._8_8_ = 0;
              local_c8._16_8_ = 0;
              local_b0 = 2;
            }
            else {
              (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                        (&local_c8,local_a0._16_8_,&local_a0,0x100);
            }
            iVar4 = QVariant::toInt((bool *)local_c8.data);
            cVar2 = QTest::qCompare(iVar4,0x3e9,"proxyModel.index(0, 2).data(Qt::UserRole).toInt()",
                                    "1001",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                    ,0x18b);
            QVariant::~QVariant((QVariant *)&local_c8);
            if (cVar2 != '\0') {
              local_80.r = -1;
              local_80.c = -1;
              local_80.i = 0;
              local_80.m = (QAbstractItemModel *)0x0;
              QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
              if ((long *)local_a0._16_8_ == (long *)0x0) {
                local_c8.shared = (PrivateShared *)0x0;
                local_c8._8_8_ = 0;
                local_c8._16_8_ = 0;
                local_b0 = 2;
              }
              else {
                (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                          (&local_c8,local_a0._16_8_,&local_a0,0x100);
              }
              iVar4 = QVariant::toInt((bool *)local_c8.data);
              cVar2 = QTest::qCompare(iVar4,0x3ea,
                                      "proxyModel.index(0, 3).data(Qt::UserRole).toInt()","1002",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x18c);
              QVariant::~QVariant((QVariant *)&local_c8);
              if (cVar2 != '\0') {
                local_80.r = -1;
                local_80.c = -1;
                local_80.i = 0;
                local_80.m = (QAbstractItemModel *)0x0;
                QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                if ((long *)local_a0._16_8_ == (long *)0x0) {
                  local_c8.shared = (PrivateShared *)0x0;
                  local_c8._8_8_ = 0;
                  local_c8._16_8_ = 0;
                  local_b0 = 2;
                }
                else {
                  (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                            (&local_c8,local_a0._16_8_,&local_a0,0x100);
                }
                iVar4 = QVariant::toInt((bool *)local_c8.data);
                cVar2 = QTest::qCompare(iVar4,0x3eb,
                                        "proxyModel.index(0, 4).data(Qt::UserRole).toInt()","1003",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x18d);
                QVariant::~QVariant((QVariant *)&local_c8);
                if (cVar2 != '\0') {
                  QPersistentModelIndex::operator_cast_to_QModelIndex
                            ((QModelIndex *)&local_c8,local_50);
                  QPersistentModelIndex::operator_cast_to_QModelIndex
                            ((QModelIndex *)&local_a0,local_50);
                  bVar1 = (bool)GenericModel::moveColumns
                                          (&local_48,iVar5,4,(QModelIndex *)0x1,(int)&local_a0);
                  cVar2 = QTest::qVerify(bVar1,
                                         "baseModel.moveColumns(parentIdx, 4, 1, parentIdx, 0)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                         ,0x18e);
                  if (cVar2 != '\0') {
                    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,local_88);
                    QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                      local_c8.shared = (PrivateShared *)0x0;
                      local_c8._8_8_ = 0;
                      local_c8._16_8_ = 0;
                      local_b0 = 2;
                    }
                    else {
                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                (&local_c8,local_a0._16_8_,&local_a0,0x100);
                    }
                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                    cVar2 = QTest::qCompare(iVar4,0x7d4,
                                            "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                            ,"2004",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                            ,399);
                    QVariant::~QVariant((QVariant *)&local_c8);
                    if (cVar2 != '\0') {
                      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,local_88);
                      QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                      if ((long *)local_a0._16_8_ == (long *)0x0) {
                        local_c8.shared = (PrivateShared *)0x0;
                        local_c8._8_8_ = 0;
                        local_c8._16_8_ = 0;
                        local_b0 = 2;
                      }
                      else {
                        (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                  (&local_c8,local_a0._16_8_,&local_a0,0x100);
                      }
                      iVar4 = QVariant::toInt((bool *)local_c8.data);
                      cVar2 = QTest::qCompare(iVar4,2000,
                                              "proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt()"
                                              ,"2000",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,400);
                      QVariant::~QVariant((QVariant *)&local_c8);
                      if (cVar2 != '\0') {
                        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,local_88);
                        QIdentityProxyModel::index((int)&local_a0,(int)&local_68,(QModelIndex *)0x0)
                        ;
                        if ((long *)local_a0._16_8_ == (long *)0x0) {
                          local_c8.shared = (PrivateShared *)0x0;
                          local_c8._8_8_ = 0;
                          local_c8._16_8_ = 0;
                          local_b0 = 2;
                        }
                        else {
                          (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                    (&local_c8,local_a0._16_8_,&local_a0,0x100);
                        }
                        iVar4 = QVariant::toInt((bool *)local_c8.data);
                        cVar2 = QTest::qCompare(iVar4,0x7d1,
                                                "proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                ,"2001",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x191);
                        QVariant::~QVariant((QVariant *)&local_c8);
                        if (cVar2 != '\0') {
                          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,local_88);
                          QIdentityProxyModel::index
                                    ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                          if ((long *)local_a0._16_8_ == (long *)0x0) {
                            local_c8.shared = (PrivateShared *)0x0;
                            local_c8._8_8_ = 0;
                            local_c8._16_8_ = 0;
                            local_b0 = 2;
                          }
                          else {
                            (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                      (&local_c8,local_a0._16_8_,&local_a0,0x100);
                          }
                          iVar4 = QVariant::toInt((bool *)local_c8.data);
                          cVar2 = QTest::qCompare(iVar4,0x7d2,
                                                  "proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x192);
                          QVariant::~QVariant((QVariant *)&local_c8);
                          if (cVar2 != '\0') {
                            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,local_88);
                            QIdentityProxyModel::index
                                      ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                            if ((long *)local_a0._16_8_ == (long *)0x0) {
                              local_c8.shared = (PrivateShared *)0x0;
                              local_c8._8_8_ = 0;
                              local_c8._16_8_ = 0;
                              local_b0 = 2;
                            }
                            else {
                              (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                        (&local_c8,local_a0._16_8_,&local_a0,0x100);
                            }
                            iVar4 = QVariant::toInt((bool *)local_c8.data);
                            cVar2 = QTest::qCompare(iVar4,0x7d3,
                                                                                                        
                                                  "proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x193);
                            QVariant::~QVariant((QVariant *)&local_c8);
                            if (cVar2 != '\0') {
                              QPersistentModelIndex::operator_cast_to_QModelIndex
                                        ((QModelIndex *)&local_c8,local_50);
                              local_a0._forAlignment = -NAN;
                              local_a0._8_8_ = 0;
                              local_a0._16_8_ = (long *)0x0;
                              bVar1 = (bool)GenericModel::moveColumns
                                                      (&local_48,iVar5,3,(QModelIndex *)0x1,
                                                       (int)&local_a0);
                              cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumns(parentIdx, 3, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x194);
                              if (cVar2 != '\0') {
                                QPersistentModelIndex::operator_cast_to_QModelIndex
                                          (&local_80,local_88);
                                QIdentityProxyModel::index
                                          ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                                if ((long *)local_a0._16_8_ == (long *)0x0) {
                                  local_c8.shared = (PrivateShared *)0x0;
                                  local_c8._8_8_ = 0;
                                  local_c8._16_8_ = 0;
                                  local_b0 = 2;
                                }
                                else {
                                  (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                            (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                }
                                iVar4 = QVariant::toInt((bool *)local_c8.data);
                                cVar2 = QTest::qCompare(iVar4,0x7d4,
                                                                                                                
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x195);
                                QVariant::~QVariant((QVariant *)&local_c8);
                                if (cVar2 != '\0') {
                                  QPersistentModelIndex::operator_cast_to_QModelIndex
                                            (&local_80,local_88);
                                  QIdentityProxyModel::index
                                            ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                                  if ((long *)local_a0._16_8_ == (long *)0x0) {
                                    local_c8.shared = (PrivateShared *)0x0;
                                    local_c8._8_8_ = 0;
                                    local_c8._16_8_ = 0;
                                    local_b0 = 2;
                                  }
                                  else {
                                    (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                              (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                  }
                                  iVar4 = QVariant::toInt((bool *)local_c8.data);
                                  cVar2 = QTest::qCompare(iVar4,2000,
                                                                                                                    
                                                  "proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x196);
                                  QVariant::~QVariant((QVariant *)&local_c8);
                                  if (cVar2 != '\0') {
                                    QPersistentModelIndex::operator_cast_to_QModelIndex
                                              (&local_80,local_88);
                                    QIdentityProxyModel::index
                                              ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                      local_c8.shared = (PrivateShared *)0x0;
                                      local_c8._8_8_ = 0;
                                      local_c8._16_8_ = 0;
                                      local_b0 = 2;
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                    }
                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                    cVar2 = QTest::qCompare(iVar4,0x7d1,
                                                                                                                        
                                                  "proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x197);
                                    QVariant::~QVariant((QVariant *)&local_c8);
                                    if (cVar2 != '\0') {
                                      QPersistentModelIndex::operator_cast_to_QModelIndex
                                                (&local_80,local_88);
                                      QIdentityProxyModel::index
                                                ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0);
                                      if ((long *)local_a0._16_8_ == (long *)0x0) {
                                        local_c8.shared = (PrivateShared *)0x0;
                                        local_c8._8_8_ = 0;
                                        local_c8._16_8_ = 0;
                                        local_b0 = 2;
                                      }
                                      else {
                                        (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                  (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                      }
                                      iVar4 = QVariant::toInt((bool *)local_c8.data);
                                      cVar2 = QTest::qCompare(iVar4,0x7d3,
                                                                                                                            
                                                  "proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x198);
                                      QVariant::~QVariant((QVariant *)&local_c8);
                                      if (cVar2 != '\0') {
                                        local_80.r = -1;
                                        local_80.c = -1;
                                        local_80.i = 0;
                                        local_80.m = (QAbstractItemModel *)0x0;
                                        QIdentityProxyModel::index
                                                  ((int)&local_a0,(int)&local_68,(QModelIndex *)0x0)
                                        ;
                                        if ((long *)local_a0._16_8_ == (long *)0x0) {
                                          local_c8.shared = (PrivateShared *)0x0;
                                          local_c8._8_8_ = 0;
                                          local_c8._16_8_ = 0;
                                          local_b0 = 2;
                                        }
                                        else {
                                          (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                    (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                        }
                                        iVar4 = QVariant::toInt((bool *)local_c8.data);
                                        cVar2 = QTest::qCompare(iVar4,0x7d2,
                                                                                                                                
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x199);
                                        QVariant::~QVariant((QVariant *)&local_c8);
                                        if (cVar2 != '\0') {
                                          local_80.r = -1;
                                          local_80.c = -1;
                                          local_80.i = 0;
                                          local_80.m = (QAbstractItemModel *)0x0;
                                          QIdentityProxyModel::index
                                                    ((int)&local_a0,(int)&local_68,
                                                     (QModelIndex *)0x0);
                                          if ((long *)local_a0._16_8_ == (long *)0x0) {
                                            local_c8.shared = (PrivateShared *)0x0;
                                            local_c8._8_8_ = 0;
                                            local_c8._16_8_ = 0;
                                            local_b0 = 2;
                                          }
                                          else {
                                            (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                      (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                          }
                                          iVar4 = QVariant::toInt((bool *)local_c8.data);
                                          cVar2 = QTest::qCompare(iVar4,1000,
                                                                                                                                    
                                                  "proxyModel.index(0, 1).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19a);
                                          QVariant::~QVariant((QVariant *)&local_c8);
                                          if (cVar2 != '\0') {
                                            local_80.r = -1;
                                            local_80.c = -1;
                                            local_80.i = 0;
                                            local_80.m = (QAbstractItemModel *)0x0;
                                            QIdentityProxyModel::index
                                                      ((int)&local_a0,(int)&local_68,
                                                       (QModelIndex *)0x0);
                                            if ((long *)local_a0._16_8_ == (long *)0x0) {
                                              local_c8.shared = (PrivateShared *)0x0;
                                              local_c8._8_8_ = 0;
                                              local_c8._16_8_ = 0;
                                              local_b0 = 2;
                                            }
                                            else {
                                              (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                        (&local_c8,local_a0._16_8_,&local_a0,0x100);
                                            }
                                            iVar4 = QVariant::toInt((bool *)local_c8.data);
                                            cVar2 = QTest::qCompare(iVar4,0x3ec,
                                                                                                                                        
                                                  "proxyModel.index(0, 2).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19b);
                                            QVariant::~QVariant((QVariant *)&local_c8);
                                            if (cVar2 != '\0') {
                                              local_80.r = -1;
                                              local_80.c = -1;
                                              local_80.i = 0;
                                              local_80.m = (QAbstractItemModel *)0x0;
                                              QIdentityProxyModel::index
                                                        ((int)&local_a0,(int)&local_68,
                                                         (QModelIndex *)0x0);
                                              if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                local_c8.shared = (PrivateShared *)0x0;
                                                local_c8._8_8_ = 0;
                                                local_c8._16_8_ = 0;
                                                local_b0 = 2;
                                              }
                                              else {
                                                (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                          (&local_c8,local_a0._16_8_,&local_a0,0x100
                                                          );
                                              }
                                              iVar4 = QVariant::toInt((bool *)local_c8.data);
                                              cVar2 = QTest::qCompare(iVar4,0x3e9,
                                                                                                                                            
                                                  "proxyModel.index(0, 3).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19c);
                                              QVariant::~QVariant((QVariant *)&local_c8);
                                              if (cVar2 != '\0') {
                                                local_80.r = -1;
                                                local_80.c = -1;
                                                local_80.i = 0;
                                                local_80.m = (QAbstractItemModel *)0x0;
                                                QIdentityProxyModel::index
                                                          ((int)&local_a0,(int)&local_68,
                                                           (QModelIndex *)0x0);
                                                if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                  local_c8.shared = (PrivateShared *)0x0;
                                                  local_c8._8_8_ = 0;
                                                  local_c8._16_8_ = 0;
                                                  local_b0 = 2;
                                                }
                                                else {
                                                  (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                            (&local_c8,local_a0._16_8_,&local_a0,
                                                             0x100);
                                                }
                                                iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                cVar2 = QTest::qCompare(iVar4,0x3ea,
                                                                                                                                                
                                                  "proxyModel.index(0, 4).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19d);
                                                QVariant::~QVariant((QVariant *)&local_c8);
                                                if (cVar2 != '\0') {
                                                  local_80.r = -1;
                                                  local_80.c = -1;
                                                  local_80.i = 0;
                                                  local_80.m = (QAbstractItemModel *)0x0;
                                                  QIdentityProxyModel::index
                                                            ((int)&local_a0,(int)&local_68,
                                                             (QModelIndex *)0x0);
                                                  if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                    local_c8.shared = (PrivateShared *)0x0;
                                                    local_c8._8_8_ = 0;
                                                    local_c8._16_8_ = 0;
                                                    local_b0 = 2;
                                                  }
                                                  else {
                                                    (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                              (&local_c8,local_a0._16_8_,&local_a0,
                                                               0x100);
                                                  }
                                                  iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                  cVar2 = QTest::qCompare(iVar4,0x3eb,
                                                                                                                                                    
                                                  "proxyModel.index(0, 5).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19e);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    local_c8._forAlignment = -NAN;
                                                    local_c8._8_8_ = 0;
                                                    local_c8._16_8_ = 0;
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              ((QModelIndex *)&local_a0,local_50);
                                                    bVar1 = (bool)GenericModel::moveColumns
                                                                            (&local_48,iVar5,4,
                                                                             (QModelIndex *)0x1,
                                                                             (int)&local_a0);
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.moveColumns(QModelIndex(), 4, 1, parentIdx, 1)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x19f);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x7d2,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a0);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,1000,
                                                                                                                                                        
                                                  "proxyModel.index(0, 1).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a1);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x3ec,
                                                                                                                                                        
                                                  "proxyModel.index(0, 2).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a2);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x3e9,
                                                                                                                                                        
                                                  "proxyModel.index(0, 3).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a3);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    local_80.r = -1;
                                                    local_80.c = -1;
                                                    local_80.i = 0;
                                                    local_80.m = (QAbstractItemModel *)0x0;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(0, 4).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a4);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex(&local_80,local_88)
                                                    ;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x7d4,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a5);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex(&local_80,local_88)
                                                    ;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x3ea,
                                                                                                                                                        
                                                  "proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a6);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex(&local_80,local_88)
                                                    ;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,2000,
                                                                                                                                                        
                                                  "proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a7);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex(&local_80,local_88)
                                                    ;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    cVar2 = QTest::qCompare(iVar4,0x7d1,
                                                                                                                                                        
                                                  "proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a8);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex(&local_80,local_88)
                                                    ;
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a0,(int)&local_68,
                                                               (QModelIndex *)0x0);
                                                    if ((long *)local_a0._16_8_ == (long *)0x0) {
                                                      local_c8.shared = (PrivateShared *)0x0;
                                                      local_c8._8_8_ = 0;
                                                      local_c8._16_8_ = 0;
                                                      local_b0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_a0._16_8_ + 0x90))
                                                                (&local_c8,local_a0._16_8_,&local_a0
                                                                 ,0x100);
                                                    }
                                                    iVar4 = QVariant::toInt((bool *)local_c8.data);
                                                    QTest::qCompare(iVar4,0x7d3,
                                                                                                                                        
                                                  "proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x1a9);
                                                  QVariant::~QVariant((QVariant *)&local_c8);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
LAB_001122e2:
  QPersistentModelIndex::~QPersistentModelIndex(local_88);
  RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&local_68);
  QPersistentModelIndex::~QPersistentModelIndex(local_50);
  GenericModel::~GenericModel((GenericModel *)&local_48);
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testMoveColumnBefore()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    const auto fillData = [](QAbstractItemModel *model, const QModelIndex &parent = QModelIndex(), int shift = 0) {
        for (int i = 0, maxI = model->rowCount(parent); i < maxI; ++i) {
            for (int j = 0, maxJ = model->columnCount(parent); j < maxJ; ++j) {
                model->setData(model->index(i, j, parent), i + shift, Qt::UserRole);
                model->setData(model->index(i, j, parent), j + shift, Qt::UserRole + 1);
            }
        }
    };
    GenericModel baseModel;
    baseModel.insertColumns(0, 5);
    baseModel.insertRows(0, 2);
    fillData(&baseModel);
    const QPersistentModelIndex parentIdx = baseModel.index(1, 0);
    baseModel.insertColumns(0, 5, parentIdx);
    baseModel.insertRows(0, 2, parentIdx);
    fillData(&baseModel, parentIdx, 50);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, &baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(&baseModel);
    const QPersistentModelIndex proxyParentIdx = proxyModel.mapFromSource(parentIdx);
    for (int i = 0; i < proxyModel.columnCount(); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(0, i), 1000 + i, Qt::UserRole));
    for (int i = 0; i < proxyModel.columnCount(proxyParentIdx); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(0, i, proxyParentIdx), 2000 + i, Qt::UserRole));
    QVERIFY(baseModel.moveColumns(QModelIndex(), 4, 1, QModelIndex(), 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(0, 1).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(0, 2).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(0, 3).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(0, 4).data(Qt::UserRole).toInt(), 1003);
    QVERIFY(baseModel.moveColumns(parentIdx, 4, 1, parentIdx, 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QVERIFY(baseModel.moveColumns(parentIdx, 3, 1, QModelIndex(), 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(0, 1).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(0, 2).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(0, 3).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(0, 4).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(0, 5).data(Qt::UserRole).toInt(), 1003);
    QVERIFY(baseModel.moveColumns(QModelIndex(), 4, 1, parentIdx, 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(0, 1).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(0, 2).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(0, 3).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(0, 4).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(0, 1, proxyParentIdx).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(0, 2, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(0, 3, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(0, 4, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
#else
    QSKIP("This test requires the GenericModel module");
#endif
}